

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_tunnel_linux.c
# Opt level: O0

int os_tunnel_linux_remove(os_tunnel *tunnel)

{
  bool bVar1;
  int result;
  os_tunnel *tunnel_local;
  
  bVar1 = false;
  if ((tunnel->_node).list.next != (list_entity *)0x0) {
    bVar1 = (tunnel->_node).list.prev != (list_entity *)0x0;
  }
  if (bVar1) {
    tunnel_local._4_4_ = _handle_tunnel(tunnel,false);
    if (tunnel_local._4_4_ == 0) {
      avl_remove(&_tunnel_tree,&tunnel->_node);
    }
  }
  else {
    tunnel_local._4_4_ = -1;
  }
  return tunnel_local._4_4_;
}

Assistant:

int
os_tunnel_linux_remove(struct os_tunnel *tunnel) {
  int result;

  if (!avl_is_node_added(&tunnel->_node)) {
    return -1;
  }

  result = _handle_tunnel(tunnel, false);
  if (!result) {
    avl_remove(&_tunnel_tree, &tunnel->_node);
  }
  return result;
}